

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationInputPatchDiscard::initRun
          (TessellationShaderTessellationInputPatchDiscard *this,_run *run,
          _tessellation_primitive_mode primitive_mode)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  int local_b0 [2];
  GLint link_status;
  uint n_varyings;
  char *varyings [2];
  GLuint local_90;
  uint n_shaders;
  GLuint shaders [2];
  char *te_body_raw_ptr;
  string te_body;
  GLchar *local_50;
  char *tc_body_raw_ptr;
  string tc_body;
  Functions *gl;
  _tessellation_primitive_mode primitive_mode_local;
  _run *run_local;
  TessellationShaderTessellationInputPatchDiscard *this_local;
  
  run->primitive_mode = primitive_mode;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  tc_body.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3c8))();
  run->po_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x21d);
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  run->tc_id = GVar2;
  GVar2 = (**(code **)(tc_body.field_2._8_8_ + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  run->te_id = GVar2;
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x223);
  getTCCode_abi_cxx11_((string *)&tc_body_raw_ptr,this);
  local_50 = (GLchar *)std::__cxx11::string::c_str();
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->tc_id,1,&local_50);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x22a);
  getTECode_abi_cxx11_((string *)&te_body_raw_ptr,this,primitive_mode);
  shaders = (GLuint  [2])std::__cxx11::string::c_str();
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,run->te_id,1,(GLchar **)shaders);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x231);
  local_90 = run->tc_id;
  n_shaders = run->te_id;
  varyings[1]._4_4_ = 2;
  TessellationShaderUtils::compileShaders(this->m_utils_ptr,2,&local_90,true);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,this->m_fs_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,run->tc_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,run->te_id);
  (**(code **)(tc_body.field_2._8_8_ + 0x10))(run->po_id,this->m_vs_id);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glAttachShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x23f);
  link_status = 0x2b17e47;
  n_varyings = 0;
  varyings[0]._0_4_ = 0x2b17e5a;
  varyings[0]._4_4_ = 0;
  local_b0[1] = 2;
  (**(code **)(tc_body.field_2._8_8_ + 0x14c8))(run->po_id,2,&link_status,0x8c8c);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glTransformFeedbackVaryings() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x246);
  local_b0[0] = 0;
  (**(code **)(tc_body.field_2._8_8_ + 0xce8))(run->po_id);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glLinkProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x24c);
  (**(code **)(tc_body.field_2._8_8_ + 0x9d8))(run->po_id,0x8b82,local_b0);
  dVar3 = (**(code **)(tc_body.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x24f);
  if (local_b0[0] != 1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
               ,0x253);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string((string *)&te_body_raw_ptr);
  std::__cxx11::string::~string((string *)&tc_body_raw_ptr);
  return;
}

Assistant:

void TessellationShaderTessellationInputPatchDiscard::initRun(_run& run, _tessellation_primitive_mode primitive_mode)
{
	run.primitive_mode = primitive_mode;

	/* Set up a program object for the descriptor */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	run.po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Set up tessellation shader objects. */
	run.tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	run.te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Configure tessellation control shader body */
	std::string tc_body			= getTCCode();
	const char* tc_body_raw_ptr = tc_body.c_str();

	shaderSourceSpecialized(run.tc_id, 1 /* count */, &tc_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader");

	/* Configure tessellation evaluation shader body */
	std::string te_body			= getTECode(primitive_mode);
	const char* te_body_raw_ptr = te_body.c_str();

	shaderSourceSpecialized(run.te_id, 1 /* count */, &te_body_raw_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader");

	/* Compile the tessellation evaluation shader */
	glw::GLuint		   shaders[] = { run.tc_id, run.te_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	m_utils_ptr->compileShaders(n_shaders, shaders, true);

	/* Attach all shader to the program object */
	gl.attachShader(run.po_id, m_fs_id);
	gl.attachShader(run.po_id, run.tc_id);
	gl.attachShader(run.po_id, run.te_id);
	gl.attachShader(run.po_id, m_vs_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() failed");

	/* Set up XFB */
	const char*		   varyings[] = { "te_tc_primitive_id", "te_primitive_id" };
	const unsigned int n_varyings = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() failed");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed");

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}
}